

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

int Cec2_ManSimulate(Gia_Man_t *p,Vec_Int_t *vTriples,Cec2_Man_t *pMan)

{
  int iObj;
  int iObj_00;
  int Lit;
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  Gia_Obj_t *pGVar4;
  word *pwVar5;
  word *pwVar6;
  word *pwVar7;
  abctime aVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int Id;
  
  aVar3 = Abc_Clock();
  iVar12 = 0;
  while ((iVar12 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar12), pGVar4 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      pGVar4 = Gia_ManObj(p,iVar12);
      pwVar5 = Cec2_ObjSim(p,iVar12);
      pwVar6 = Cec2_ObjSim(p,iVar12 - (*(uint *)pGVar4 & 0x1fffffff));
      pwVar7 = Cec2_ObjSim(p,iVar12 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
      uVar10 = *(ulong *)pGVar4;
      uVar9 = (ulong)(uint)p->nSimWords;
      if (p->nSimWords < 1) {
        uVar9 = 0;
      }
      if (((uint)uVar10 >> 0x1d & 1) == 0) {
        if ((uVar10 >> 0x3d & 1) == 0) {
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            pwVar5[uVar10] = pwVar7[uVar10] & pwVar6[uVar10];
          }
        }
        else {
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            pwVar5[uVar10] = ~pwVar7[uVar10] & pwVar6[uVar10];
          }
        }
      }
      else if ((uVar10 >> 0x3d & 1) == 0) {
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          pwVar5[uVar10] = ~pwVar6[uVar10] & pwVar7[uVar10];
        }
      }
      else {
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          pwVar5[uVar10] = ~(pwVar7[uVar10] | pwVar6[uVar10]);
        }
      }
    }
    iVar12 = iVar12 + 1;
  }
  aVar8 = Abc_Clock();
  pMan->timeSim = pMan->timeSim + (aVar8 - aVar3);
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    iVar12 = 0;
  }
  else {
    Id = 0;
    iVar12 = 0;
    if (vTriples != (Vec_Int_t *)0x0) {
      iVar12 = 0;
      for (iVar11 = 1; iVar11 + 1 < vTriples->nSize; iVar11 = iVar11 + 3) {
        iObj = Vec_IntEntry(vTriples,iVar11 + -1);
        iObj_00 = Vec_IntEntry(vTriples,iVar11);
        Lit = Vec_IntEntry(vTriples,iVar11 + 1);
        pwVar5 = Cec2_ObjSim(p,iObj);
        pwVar6 = Cec2_ObjSim(p,iObj_00);
        uVar1 = Abc_Lit2Var(Lit);
        uVar2 = Abc_LitIsCompl(Lit);
        iVar12 = iVar12 + (uint)(((*(uint *)((long)pwVar5 + (ulong)(uVar1 >> 5) * 4) >>
                                   (uVar1 & 0x1f) & 1) != 0 ^ uVar2) ==
                                (uint)((*(uint *)((long)pwVar6 + (ulong)(uVar1 >> 5) * 4) >>
                                        (uVar1 & 0x1f) & 1) != 0));
      }
    }
    aVar3 = Abc_Clock();
    for (; Id < p->nObjs; Id = Id + 1) {
      iVar11 = Gia_ObjIsHead(p,Id);
      if (iVar11 != 0) {
        Cec2_ManSimClassRefineOne(p,Id);
      }
    }
    aVar8 = Abc_Clock();
    pMan->timeRefine = pMan->timeRefine + (aVar8 - aVar3);
  }
  return iVar12;
}

Assistant:

int Cec2_ManSimulate( Gia_Man_t * p, Vec_Int_t * vTriples, Cec2_Man_t * pMan )
{
    extern void Cec2_ManSimClassRefineOne( Gia_Man_t * p, int iRepr );
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; 
    int i, iRepr, iObj, Entry, Count = 0;
    //Cec2_ManSaveCis( p );
    Gia_ManForEachAnd( p, pObj, i )
        Cec2_ObjSimAnd( p, i );
    pMan->timeSim += Abc_Clock() - clk;
    if ( p->pReprs == NULL )
        return 0;
    if ( vTriples )
    {
        Vec_IntForEachEntryTriple( vTriples, iRepr, iObj, Entry, i )
        {
            word * pSim0 = Cec2_ObjSim( p, iRepr );
            word * pSim1 = Cec2_ObjSim( p, iObj );
            int iPat     = Abc_Lit2Var(Entry);
            int fPhase   = Abc_LitIsCompl(Entry);
            if ( (fPhase ^ Abc_InfoHasBit((unsigned *)pSim0, iPat)) == Abc_InfoHasBit((unsigned *)pSim1, iPat) )
                Count++;
        }
    }
    clk = Abc_Clock();
    Gia_ManForEachClass0( p, i )
        Cec2_ManSimClassRefineOne( p, i );
    pMan->timeRefine += Abc_Clock() - clk;
    return Count;
}